

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
geemuboi::test::core::CpuTest_ldi_mhl_a_Test::~CpuTest_ldi_mhl_a_Test(CpuTest_ldi_mhl_a_Test *this)

{
  CpuTest::~CpuTest(&this->super_CpuTest);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CpuTest, ldi_mhl_a) {
    regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;

    regs.a = 0xFE;
    regs.h = 0x33;
    regs.l = 0x44;

    EXPECT_CALL(mmu, write_byte(make_addr(regs.h, regs.l), regs.a));
    execute_instruction(0x22);

    ICpu::Registers expected_regs{};
    expected_regs.a = 0xFE;
    expected_regs.h = 0x33;
    expected_regs.l = 0x45;
    expected_regs.f = ICpu::Z_FLAG | ICpu::N_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}